

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void nuts_tran_exchange(char *scheme)

{
  _Bool _Var1;
  nng_err nVar2;
  int iVar3;
  nng_err num;
  char *pcVar4;
  bool bVar5;
  undefined4 uVar6;
  nng_err result__12;
  nng_err result__11;
  int rv__1;
  size_t sz__1;
  char buf__1 [64];
  nng_err result__10;
  int rv_;
  size_t sz_;
  char buf_ [64];
  int local_58;
  nng_err result__9;
  int i;
  nng_err result__8;
  nng_err result__7;
  nng_err result__6;
  nng_err result__5;
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  nng_url *url;
  char *addr;
  nng_dialer d1;
  nng_listener l1;
  nng_socket s2;
  nng_socket s1;
  char *scheme_local;
  
  memset(&l1,0,4);
  memset(&d1,0,4);
  memset((void *)((long)&addr + 4),0,4);
  memset(&addr,0,4);
  pcVar4 = strchr(scheme,0x36);
  if ((pcVar4 == (char *)0x0) || (_Var1 = nuts_has_ipv6(), _Var1)) {
    nuts_scratch_addr_zero(scheme,0x40,nuts_tran_exchange::nuts_addr_);
    url = (nng_url *)nuts_tran_exchange::nuts_addr_;
    nVar2 = nng_pair1_open((nng_socket *)&l1);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x17e,"%s: expected success, got %s (%d)","nng_pair1_open(&(s1))",pcVar4
                           ,nVar2);
    if (iVar3 == 0) {
      acutest_abort_();
    }
    nVar2 = nng_pair1_open((nng_socket *)&d1);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x17f,"%s: expected success, got %s (%d)","nng_pair1_open(&(s2))",pcVar4
                           ,nVar2);
    if (iVar3 == 0) {
      acutest_abort_();
    }
    nVar2 = nng_socket_set_ms((nng_socket)l1.id,"send-timeout",100);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x180,"%s: expected success, got %s (%d)",
                           "nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, 100)",pcVar4,nVar2);
    if (iVar3 == 0) {
      acutest_abort_();
    }
    nVar2 = nng_socket_set_ms((nng_socket)d1.id,"send-timeout",100);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x181,"%s: expected success, got %s (%d)",
                           "nng_socket_set_ms(s2, NNG_OPT_SENDTIMEO, 100)",pcVar4,nVar2);
    if (iVar3 == 0) {
      acutest_abort_();
    }
    nVar2 = nng_socket_set_ms((nng_socket)l1.id,"recv-timeout",100);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x182,"%s: expected success, got %s (%d)",
                           "nng_socket_set_ms(s1, NNG_OPT_RECVTIMEO, 100)",pcVar4,nVar2);
    if (iVar3 == 0) {
      acutest_abort_();
    }
    nVar2 = nng_socket_set_ms((nng_socket)d1.id,"recv-timeout",100);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x183,"%s: expected success, got %s (%d)",
                           "nng_socket_set_ms(s2, NNG_OPT_RECVTIMEO, 100)",pcVar4,nVar2);
    if (iVar3 == 0) {
      acutest_abort_();
    }
    nVar2 = nng_listen((nng_socket)l1.id,(char *)url,(nng_listener *)((long)&addr + 4),0);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x184,"%s: expected success, got %s (%d)","nng_listen(s1, addr, &l1, 0)"
                           ,pcVar4,nVar2);
    if (iVar3 == 0) {
      acutest_abort_();
    }
    nVar2 = nng_listener_get_url(addr._4_4_,(nng_url **)&result__1);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x185,"%s: expected success, got %s (%d)",
                           "nng_listener_get_url(l1, &url)",pcVar4,nVar2);
    if (iVar3 == 0) {
      acutest_abort_();
    }
    nVar2 = nng_dial_url((nng_socket)d1.id,_result__1,(nng_dialer *)&addr,0);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x186,"%s: expected success, got %s (%d)",
                           "nng_dial_url(s2, url, &d1, 0)",pcVar4,nVar2);
    if (iVar3 == 0) {
      acutest_abort_();
    }
    iVar3 = nng_listener_id(addr._4_4_);
    acutest_check_((uint)(0 < iVar3),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                   ,0x187,"%s","nng_listener_id(l1) > 0");
    iVar3 = nng_dialer_id(addr._0_4_);
    acutest_check_((uint)(0 < iVar3),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                   ,0x188,"%s","nng_dialer_id(d1) > 0");
    for (local_58 = 0; local_58 < 5; local_58 = local_58 + 1) {
      nVar2 = nng_send((nng_socket)l1.id,"ping",5,0);
      pcVar4 = nng_strerror(nVar2);
      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                             ,0x18a,"%s: expected success, got %s (%d)",
                             "nng_send(s1, \"ping\", strlen(\"ping\") + 1, 0)",pcVar4,nVar2);
      if (iVar3 == 0) {
        acutest_abort_();
      }
      _result__10 = 0x40;
      num = nng_recv((nng_socket)d1.id,&sz_,(size_t *)&result__10,0);
      buf__1._60_4_ = num;
      pcVar4 = nng_strerror(num);
      acutest_check_((uint)(num == NNG_OK),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                     ,0x18b,"nng_recv (%d %s)",(ulong)num,pcVar4,nVar2);
      acutest_check_((uint)(_result__10 == 5),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                     ,0x18b,"length %d want %d",_result__10 & 0xffffffff,5);
      buf_[0x37] = '\0';
      iVar3 = strcmp("ping",(char *)&sz_);
      acutest_check_((uint)(iVar3 == 0),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                     ,0x18b,"%s == %s","ping",&sz_);
      buf__1._56_4_ = nng_send((nng_socket)d1.id,"acknowledge",0xc,0);
      bVar5 = buf__1._56_4_ == NNG_OK;
      pcVar4 = nng_strerror(buf__1._56_4_);
      uVar6 = buf__1._56_4_;
      iVar3 = acutest_check_((uint)bVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                             ,0x18c,"%s: expected success, got %s (%d)",
                             "nng_send(s2, \"acknowledge\", strlen(\"acknowledge\") + 1, 0)",pcVar4,
                             buf__1._56_4_);
      if (iVar3 == 0) {
        acutest_abort_();
      }
      _result__11 = 0x40;
      nVar2 = nng_recv((nng_socket)l1.id,&sz__1,(size_t *)&result__11,0);
      pcVar4 = nng_strerror(nVar2);
      acutest_check_((uint)(nVar2 == NNG_OK),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                     ,0x18d,"nng_recv (%d %s)",(ulong)nVar2,pcVar4,uVar6);
      acutest_check_((uint)(_result__11 == 0xc),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                     ,0x18d,"length %d want %d",_result__11 & 0xffffffff,0xc);
      buf__1[0x37] = '\0';
      iVar3 = strcmp("acknowledge",(char *)&sz__1);
      acutest_check_((uint)(iVar3 == 0),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                     ,0x18d,"%s == %s","acknowledge",&sz__1);
    }
    nVar2 = nng_socket_close((nng_socket)l1.id);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,399,"%s: expected success, got %s (%d)","nng_socket_close(s1)",pcVar4,
                           nVar2);
    if (iVar3 == 0) {
      acutest_abort_();
    }
    nVar2 = nng_socket_close((nng_socket)d1.id);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,400,"%s: expected success, got %s (%d)","nng_socket_close(s2)",pcVar4,
                           nVar2);
    if (iVar3 == 0) {
      acutest_abort_();
    }
  }
  else {
    acutest_skip_("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                  ,0x17c,"No IPv6 support present");
  }
  return;
}

Assistant:

void
nuts_tran_exchange(const char *scheme)
{
	nng_socket     s1 = NNG_SOCKET_INITIALIZER;
	nng_socket     s2 = NNG_SOCKET_INITIALIZER;
	nng_listener   l1 = NNG_LISTENER_INITIALIZER;
	nng_dialer     d1 = NNG_LISTENER_INITIALIZER;
	const char    *addr;
	const nng_url *url;

	NUTS_SKIP_IF_IPV6_NEEDED_AND_ABSENT(scheme);
	NUTS_ADDR_ZERO(addr, scheme);
	NUTS_OPEN(s1);
	NUTS_OPEN(s2);
	NUTS_PASS(nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, 100));
	NUTS_PASS(nng_socket_set_ms(s2, NNG_OPT_SENDTIMEO, 100));
	NUTS_PASS(nng_socket_set_ms(s1, NNG_OPT_RECVTIMEO, 100));
	NUTS_PASS(nng_socket_set_ms(s2, NNG_OPT_RECVTIMEO, 100));
	NUTS_PASS(nng_listen(s1, addr, &l1, 0));
	NUTS_PASS(nng_listener_get_url(l1, &url));
	NUTS_PASS(nng_dial_url(s2, url, &d1, 0));
	NUTS_TRUE(nng_listener_id(l1) > 0);
	NUTS_TRUE(nng_dialer_id(d1) > 0);
	for (int i = 0; i < 5; i++) {
		NUTS_SEND(s1, "ping");
		NUTS_RECV(s2, "ping");
		NUTS_SEND(s2, "acknowledge");
		NUTS_RECV(s1, "acknowledge");
	}
	NUTS_CLOSE(s1);
	NUTS_CLOSE(s2);
}